

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk98(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk98_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk98.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk98.version);
    if ((bios->power).unk98.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk98.offset + 1,&(bios->power).unk98.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk98.offset + 2,&(bios->power).unk98.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk98.offset + 3,&(bios->power).unk98.entriesnum);
      (bios->power).unk98.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk98.entriesnum;
      peVar5 = (envy_bios_power_unk98_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk98.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk98.rlen * (int)uVar6 +
             (uint)(bios->power).unk98.hlen + (bios->power).unk98.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown OVERCLOCKING table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk98(struct envy_bios *bios) {
	struct envy_bios_power_unk98 *unk98 = &bios->power.unk98;
	int i, err = 0;

	if (!unk98->offset)
		return -EINVAL;

	bios_u8(bios, unk98->offset + 0x0, &unk98->version);
	switch(unk98->version) {
	case 0x10:
		err |= bios_u8(bios, unk98->offset + 0x1, &unk98->hlen);
		err |= bios_u8(bios, unk98->offset + 0x2, &unk98->rlen);
		err |= bios_u8(bios, unk98->offset + 0x3, &unk98->entriesnum);
		unk98->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown OVERCLOCKING table version 0x%x\n", unk98->version);
		return -EINVAL;
	};

	err = 0;
	unk98->entries = malloc(unk98->entriesnum * sizeof(struct envy_bios_power_unk98_entry));
	for (i = 0; i < unk98->entriesnum; i++) {
		uint32_t data = unk98->offset + unk98->hlen + i * unk98->rlen;

		unk98->entries[i].offset = data;
	}

	return 0;
}